

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

void assignment(LexState *ls,LHS_assign *lh,int nvars)

{
  int *piVar1;
  Instruction *pIVar2;
  bool bVar3;
  int iVar4;
  LHS_assign *pLVar5;
  FuncState *pFVar6;
  FuncState *fs;
  expdesc e;
  undefined1 local_40 [8];
  expdesc local_38;
  
  if (3 < (lh->v).k - VLOCAL) {
    luaX_lexerror(ls,"syntax error",(ls->t).token);
  }
  iVar4 = testnext(ls,0x2c);
  if (iVar4 == 0) {
    checknext(ls,0x3d);
    iVar4 = explist1(ls,(expdesc *)local_40);
    pFVar6 = ls->fs;
    if (nvars != iVar4) {
      adjust_assign((LexState *)pFVar6,nvars,iVar4,(expdesc *)local_40);
      if (nvars < iVar4) {
        piVar1 = &ls->fs->freereg;
        *piVar1 = *piVar1 + (nvars - iVar4);
      }
      goto LAB_00110345;
    }
    if (local_40._0_4_ == VVARARG) {
      pIVar2 = pFVar6->f->code;
      pIVar2[(int)local_38.k] = pIVar2[(int)local_38.k] & 0x7fffff | 0x1000000;
      local_40._0_4_ = 0xb;
      goto LAB_00110363;
    }
    if (local_40._0_4_ != VCALL) goto LAB_00110363;
    local_38.k = pFVar6->f->code[(int)local_38.k] >> 6 & 0xff;
  }
  else {
    local_40 = (undefined1  [8])lh;
    primaryexp(ls,&local_38);
    if (local_38.k == VLOCAL) {
      pFVar6 = ls->fs;
      iVar4 = pFVar6->freereg;
      bVar3 = false;
      pLVar5 = lh;
      do {
        while ((pLVar5->v).k != VINDEXED) {
LAB_001102e1:
          pLVar5 = pLVar5->prev;
          if (pLVar5 == (LHS_assign *)0x0) {
            if (!bVar3) goto LAB_0011031d;
            goto LAB_001102f1;
          }
        }
        if ((pLVar5->v).u.s.info == local_38.u.s.info) {
          (pLVar5->v).u.s.info = iVar4;
          bVar3 = true;
        }
        if ((pLVar5->v).u.s.aux != local_38.u.s.info) goto LAB_001102e1;
        (pLVar5->v).u.s.aux = iVar4;
        pLVar5 = pLVar5->prev;
        bVar3 = true;
      } while (pLVar5 != (LHS_assign *)0x0);
LAB_001102f1:
      luaK_code(pFVar6,local_38.u.s.info << 0x17 | pFVar6->freereg << 6,pFVar6->ls->lastline);
      luaK_checkstack(pFVar6,1);
      pFVar6->freereg = pFVar6->freereg + 1;
    }
LAB_0011031d:
    iVar4 = 200 - (uint)ls->L->nCcalls;
    if (iVar4 < nvars) {
      errorlimit(ls->fs,iVar4,"variables in assignment");
    }
    assignment(ls,(LHS_assign *)local_40,nvars + 1);
LAB_00110345:
    pFVar6 = ls->fs;
    local_38.k = pFVar6->freereg - VNIL;
    local_38.u.nval = -NAN;
  }
  local_40._0_4_ = 0xc;
LAB_00110363:
  luaK_storevar(pFVar6,&lh->v,(expdesc *)local_40);
  return;
}

Assistant:

static void assignment(LexState*ls,struct LHS_assign*lh,int nvars){
expdesc e;
check_condition(ls,VLOCAL<=lh->v.k&&lh->v.k<=VINDEXED,
"syntax error");
if(testnext(ls,',')){
struct LHS_assign nv;
nv.prev=lh;
primaryexp(ls,&nv.v);
if(nv.v.k==VLOCAL)
check_conflict(ls,lh,&nv.v);
luaY_checklimit(ls->fs,nvars,200-ls->L->nCcalls,
"variables in assignment");
assignment(ls,&nv,nvars+1);
}
else{
int nexps;
checknext(ls,'=');
nexps=explist1(ls,&e);
if(nexps!=nvars){
adjust_assign(ls,nvars,nexps,&e);
if(nexps>nvars)
ls->fs->freereg-=nexps-nvars;
}
else{
luaK_setoneret(ls->fs,&e);
luaK_storevar(ls->fs,&lh->v,&e);
return;
}
}
init_exp(&e,VNONRELOC,ls->fs->freereg-1);
luaK_storevar(ls->fs,&lh->v,&e);
}